

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsSurfaceGeometry<3L>::set_knots_u
          (NurbsSurfaceGeometry<3L> *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value)

{
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value_local;
  NurbsSurfaceGeometry<3L> *this_local;
  
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->m_knots_u,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)value);
  return;
}

Assistant:

void set_knots_u(Eigen::Ref<const Eigen::VectorXd> value)
    {
        m_knots_u = value;
    }